

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O1

int funchook_set_debug_file(char *name)

{
  if (name == (char *)0x0) {
    funchook_debug_file[0] = '\0';
  }
  else {
    strncpy(funchook_debug_file,name,0xfff);
    funchook_debug_file[0xfff] = '\0';
  }
  return 0;
}

Assistant:

int funchook_set_debug_file(const char *name)
{
    if (name != NULL) {
        strncpy(funchook_debug_file, name, sizeof(funchook_debug_file) - 1);
        funchook_debug_file[sizeof(funchook_debug_file) - 1] = '\0';
    } else {
        funchook_debug_file[0] = '\0';
    }
    return 0;
}